

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<true,double,duckdb::DistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  const_reference pvVar3;
  ulong uVar4;
  idx_t iVar5;
  SelectionVector *pSVar6;
  uint uVar7;
  idx_t iVar8;
  ulong uVar9;
  ulong uVar10;
  uchar **rhs_locations;
  idx_t iVar11;
  bool bVar12;
  SelectionVector *lhs_sel;
  double local_68;
  data_ptr_t local_60;
  idx_t local_58;
  value_type local_50;
  ulong local_48;
  SelectionVector *local_40;
  idx_t local_38;
  
  puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  local_40 = (lhs_format->unified).sel;
  local_60 = (lhs_format->unified).data;
  pdVar2 = rhs_row_locations->data;
  pvVar3 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  local_48 = col_idx >> 3;
  local_50 = *pvVar3;
  local_58 = count;
  if (puVar1 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar9 = 0;
      iVar8 = 0;
      do {
        uVar10 = uVar9;
        if (sel->sel_vector != (sel_t *)0x0) {
          uVar10 = (ulong)sel->sel_vector[uVar9];
        }
        uVar4 = uVar10;
        if (local_40->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)local_40->sel_vector[uVar10];
        }
        local_68 = *(double *)(*(long *)(pdVar2 + uVar10 * 8) + local_50);
        if (((1 << ((byte)col_idx & 7) & (uint)*(byte *)(*(long *)(pdVar2 + uVar10 * 8) + local_48))
             == 0) ||
           (bVar12 = Equals::Operation<double>((double *)(local_60 + uVar4 * 8),&local_68),
           count = local_58, !bVar12)) {
          iVar11 = iVar8 + 1;
          iVar5 = iVar8;
          pSVar6 = sel;
        }
        else {
          iVar5 = *no_match_count;
          *no_match_count = iVar5 + 1;
          pSVar6 = no_match_sel;
          iVar11 = iVar8;
        }
        pSVar6->sel_vector[iVar5] = (sel_t)uVar10;
        uVar9 = uVar9 + 1;
        iVar8 = iVar11;
      } while (count != uVar9);
      return iVar11;
    }
  }
  else if (count != 0) {
    local_38 = 0;
    iVar8 = 0;
    do {
      iVar5 = iVar8;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar5 = (idx_t)sel->sel_vector[iVar8];
      }
      iVar11 = iVar5;
      if (local_40->sel_vector != (sel_t *)0x0) {
        iVar11 = (idx_t)local_40->sel_vector[iVar5];
      }
      puVar1 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        bVar12 = false;
      }
      else {
        bVar12 = (puVar1[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0;
      }
      uVar7 = (uint)*(byte *)(*(long *)(pdVar2 + iVar5 * 8) + local_48) & 1 << ((byte)col_idx & 7);
      local_68 = *(double *)(*(long *)(pdVar2 + iVar5 * 8) + local_50);
      if ((bVar12) || (uVar7 == 0)) {
        bVar12 = (bool)(bVar12 ^ uVar7 == 0);
      }
      else {
        bVar12 = Equals::Operation<double>((double *)(local_60 + iVar11 * 8),&local_68);
        bVar12 = !bVar12;
        count = local_58;
      }
      if (bVar12) {
        iVar11 = local_38;
        pSVar6 = sel;
        local_38 = local_38 + 1;
      }
      else {
        iVar11 = *no_match_count;
        *no_match_count = iVar11 + 1;
        pSVar6 = no_match_sel;
      }
      pSVar6->sel_vector[iVar11] = (sel_t)iVar5;
      iVar8 = iVar8 + 1;
    } while (count != iVar8);
    return local_38;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}